

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O1

bool __thiscall ON_PolyEdgeCurve::ContainsAllEdges(ON_PolyEdgeCurve *this)

{
  int iVar1;
  ON_PolyEdgeSegment *pOVar2;
  bool bVar3;
  int segment_index;
  
  iVar1 = ON_PolyCurve::Count(&this->super_ON_PolyCurve);
  bVar3 = iVar1 < 1;
  if ((0 < iVar1) && (pOVar2 = SegmentCurve(this,0), pOVar2 != (ON_PolyEdgeSegment *)0x0)) {
    segment_index = 1;
    do {
      if (pOVar2->m_edge == (ON_BrepEdge *)0x0) {
        return bVar3;
      }
      bVar3 = iVar1 <= segment_index;
      if (segment_index == iVar1) {
        return bVar3;
      }
      pOVar2 = SegmentCurve(this,segment_index);
      segment_index = segment_index + 1;
    } while (pOVar2 != (ON_PolyEdgeSegment *)0x0);
  }
  return bVar3;
}

Assistant:

bool ON_PolyEdgeCurve::ContainsAllEdges() const
{
  int i, count = SegmentCount();
  for( i = 0; i < count; i++)
  {
    ON_PolyEdgeSegment* segment = SegmentCurve(i);
    if( nullptr == segment || nullptr == segment->BrepEdge())
    {
      return false;
    }
  }
  return true;
}